

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mspec.c
# Opt level: O0

void apet_force(CHAR_DATA *ch,char *cmd,int delay)

{
  ulong uVar1;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_const_char_*> *pfVar2;
  int nTimer;
  char *pcVar3;
  int *piVar4;
  undefined4 in_EDX;
  CQueue *extraout_RDX;
  string *in_RSI;
  undefined8 in_RDI;
  undefined1 in_stack_00000010 [16];
  string_view in_stack_00000020;
  string buffer;
  char *tcmd;
  allocator<char> *in_stack_fffffffffffffde0;
  allocator<char> *__a;
  char **__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  int local_1f4;
  int local_1f0;
  allocator<char> local_1e9;
  string local_1e8 [39];
  allocator<char> local_1c1;
  string local_1c0 [39];
  allocator<char> local_199;
  string local_198 [39];
  allocator<char> local_171;
  string local_170 [55];
  allocator<char> local_139;
  string local_138 [32];
  char *local_118;
  undefined8 local_110;
  string local_108 [16];
  undefined8 in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined8 funcName;
  undefined4 nTimer_00;
  undefined1 local_c8 [4];
  CQueue *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  char *local_88;
  undefined8 uStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  char *local_70;
  char **local_68;
  char *local_60;
  char **local_58;
  char **local_50;
  char *local_48;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined8 local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  char *local_8;
  
  __s = &local_118;
  local_70 = "You feel the irresistible urge to \'{}}\'.\n\r";
  local_60 = "You feel the irresistible urge to \'{}}\'.\n\r";
  local_118 = "You feel the irresistible urge to \'{}}\'.\n\r";
  funcName = in_RSI;
  local_68 = __s;
  local_58 = __s;
  pcVar3 = (char *)std::char_traits<char>::length((char_type *)0x797a32);
  __s[1] = pcVar3;
  local_8 = local_70;
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108;
  local_88 = local_118;
  uStack_80 = local_110;
  local_50 = &local_88;
  local_48 = local_118;
  local_78 = this;
  _local_c8 = fmt::v9::
              make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char_const*&>
                        ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_const_char_*>
                          *)&stack0xffffffffffffff28,(v9 *)in_RSI,(char **)this);
  local_30 = &stack0xffffffffffffff50;
  local_38 = local_c8;
  local_20 = 0xc;
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc;
  this_00 = extraout_RDX;
  local_28 = local_38;
  local_18 = local_30;
  local_10 = local_38;
  fmt::v9::vformat_abi_cxx11_(in_stack_00000020,(format_args)in_stack_00000010);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,in_stack_fffffffffffffde0);
  __a = &local_171;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
  pfVar2 = _local_c8;
  uVar1 = (ulong)_local_c8 >> 0x20;
  nTimer = (int)uVar1;
  _local_c8 = pfVar2;
  CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,std::__cxx11::string>
            (this_00,nTimer,(string *)in_RDI,(string *)funcName,
             (_func_void_char_data_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              *)CONCAT44(in_EDX,in_stack_ffffffffffffff20),(char_data **)in_stack_ffffffffffffff18,
             args_1);
  nTimer_00 = (undefined4)((ulong)funcName >> 0x20);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator(&local_199);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator(&local_171);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator(&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
  CQueue::AddToQueue<void(*)(std::__cxx11::string,char_data*),std::__cxx11::string&,char_data*&>
            ((CQueue *)in_RDI,nTimer_00,(string *)CONCAT44(in_EDX,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18,
             (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_char_data_ptr
              *)in_stack_ffffffffffffff10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff08,(char_data **)this_00);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  local_1f0 = (int)*(short *)(in_RDI + 0x152);
  local_1f4 = 0x14;
  piVar4 = std::min<int>(&local_1f0,&local_1f4);
  *(short *)(in_RDI + 0x152) = (short)*piVar4;
  std::__cxx11::string::~string(local_108);
  return;
}

Assistant:

void apet_force(CHAR_DATA *ch, const char *cmd, int delay)
{
	char *tcmd;

	auto buffer = fmt::format("You feel the irresistible urge to '{}}'.\n\r", cmd);

	RS.Queue.AddToQueue(delay, "apet_force", "interpret_queue", interpret_queue, ch, std::string(cmd));
	RS.Queue.AddToQueue(delay, "apet_force", "send_to_char_queue", send_to_char_queue, buffer, ch);

	ch->wait = std::min((int)ch->wait, 20);
}